

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::Buffer<wchar_t>::append<wchar_t>(Buffer<wchar_t> *this,wchar_t *begin,wchar_t *end)

{
  long lVar1;
  Type_conflict TVar2;
  ulong uVar3;
  wchar_t *in_RDX;
  wchar_t *in_RSI;
  wchar_t *in_RDI;
  size_t new_size;
  
  lVar1 = *(long *)(in_RDI + 4);
  TVar2 = internal::to_unsigned<long>((long)in_RDX - (long)in_RSI >> 2);
  uVar3 = lVar1 + TVar2;
  if (*(ulong *)(in_RDI + 6) < uVar3) {
    (*(code *)**(undefined8 **)in_RDI)(in_RDI,uVar3);
  }
  internal::make_ptr<wchar_t>(*(wchar_t **)(in_RDI + 2),*(size_t *)(in_RDI + 6));
  std::uninitialized_copy<wchar_t_const*,wchar_t*>(in_RDI,in_RDX,in_RSI);
  *(ulong *)(in_RDI + 4) = uVar3;
  return;
}

Assistant:

void Buffer<T>::append(const U *begin, const U *end) {
  std::size_t new_size = size_ + internal::to_unsigned(end - begin);
  if (new_size > capacity_)
    grow(new_size);
  std::uninitialized_copy(begin, end,
                          internal::make_ptr(ptr_, capacity_) + size_);
  size_ = new_size;
}